

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O2

RequiredExtensions *
deqp::gls::TextureStateQueryTests::anon_unknown_1::getTextureTargetExtension
          (RequiredExtensions *__return_storage_ptr__,ContextType *contextType,GLenum target)

{
  bool bVar1;
  char *ext;
  
  bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x23);
  if (!bVar1) {
    bVar1 = glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x13);
    if (bVar1) {
      if (target == 0x8c2a) {
        ext = "GL_EXT_texture_buffer";
      }
      else if (target == 0x9009) {
        ext = "GL_EXT_texture_cube_map_array";
      }
      else {
        if (target != 0x9102) goto LAB_0083a27c;
        ext = "GL_OES_texture_storage_multisample_2d_array";
      }
      RequiredExtensions::RequiredExtensions(__return_storage_ptr__,ext);
      return __return_storage_ptr__;
    }
    glu::contextSupports((ContextType)(contextType->super_ApiType).m_bits,(ApiType)0x3);
  }
LAB_0083a27c:
  (__return_storage_ptr__->m_extensions).
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->m_extensions).
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_extensions).
  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

static RequiredExtensions getTextureTargetExtension (const glu::ContextType& contextType, glw::GLenum target)
{
	DE_ASSERT(!isCoreTextureTarget(contextType, target));

	if (contextSupports(contextType, glu::ApiType::es(3,2)))
		return es32::getTextureTargetExtension(target);
	if (contextSupports(contextType, glu::ApiType::es(3,1)))
		return es31::getTextureTargetExtension(target);
	else if (contextSupports(contextType, glu::ApiType::es(3,0)))
		return es30::getTextureTargetExtension(target);
	else
	{
		DE_ASSERT(false);
		return RequiredExtensions();
	}
}